

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

FileError * CLI::FileError::Missing(string *name)

{
  FileError *in_RDI;
  string *in_stack_00000018;
  FileError *in_stack_00000020;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  ::std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  FileError(in_stack_00000020,in_stack_00000018);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

static FileError Missing(std::string name) { return FileError(name + " was not readable (missing?)"); }